

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O0

void __thiscall wmj::fileWatcher::fileWatcher::~fileWatcher(fileWatcher *this)

{
  fileWatcher *this_local;
  
  this->_vptr_fileWatcher = (_func_int **)&PTR__fileWatcher_00142d60;
  this->need_watching = false;
  startWatch(this);
  stopWatch(this);
  std::function<void_()>::~function(&this->call_back_func);
  std::__cxx11::string::~string((string *)&this->file_name);
  return;
}

Assistant:

fileWatcher::~fileWatcher() {
    need_watching = false;
    startWatch();
    stopWatch();
}